

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchcache.hpp
# Opt level: O2

void __thiscall
CorUnix::CSynchCache<CorUnix::CSynchData>::Flush
          (CSynchCache<CorUnix::CSynchData> *this,CPalThread *pthrCurrent,bool fDontLock)

{
  _USynchCacheStackNode *p_Var1;
  undefined3 in_register_00000011;
  _USynchCacheStackNode *pvMem;
  
  if (CONCAT31(in_register_00000011,fDontLock) == 0) {
    InternalEnterCriticalSection(pthrCurrent,&this->m_cs);
  }
  pvMem = (this->m_pHead).m_val;
  (this->m_pHead).m_val = (_USynchCacheStackNode *)0x0;
  (this->m_iDepth).m_val = 0;
  if (!fDontLock) {
    InternalLeaveCriticalSection(pthrCurrent,&this->m_cs);
  }
  while (pvMem != (_USynchCacheStackNode *)0x0) {
    p_Var1 = pvMem->next;
    InternalFree(pvMem);
    pvMem = p_Var1;
  }
  return;
}

Assistant:

void Flush(CPalThread * pthrCurrent, bool fDontLock = false)
        {
            USynchCacheStackNode * pNode, * pTemp;

            if (!fDontLock)
            {
                Lock(pthrCurrent);
            }
            pNode = m_pHead;
            m_pHead = NULL;
            m_iDepth = 0;
            if (!fDontLock)
            {
                Unlock(pthrCurrent);
            }

            while (pNode)
            {
                pTemp = pNode;
                pNode = pNode->next;
                InternalDelete((char *)pTemp);
            }
        }